

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroupPrivate::applyGroupState
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation)

{
  parameter_type pVar1;
  QAbstractAnimation *in_RSI;
  
  pVar1 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x67d040);
  if (pVar1 != Stopped) {
    if (pVar1 == Paused) {
      QAbstractAnimation::pause(in_RSI);
    }
    else if (pVar1 == Running) {
      QAbstractAnimation::start((QAbstractAnimation *)in_RSI,2);
    }
  }
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::applyGroupState(QAbstractAnimation *animation)
{
    switch (state)
    {
    case QAbstractAnimation::Running:
        animation->start();
        break;
    case QAbstractAnimation::Paused:
        animation->pause();
        break;
    case QAbstractAnimation::Stopped:
    default:
        break;
    }
}